

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__gif_header(stbi__context *s,stbi__gif *g,int *comp,int is_info)

{
  byte bVar1;
  int iVar2;
  stbi_uc *psVar3;
  stbi_uc *psVar4;
  stbi_uc *psVar5;
  stbi_uc sVar6;
  uint uVar7;
  
  psVar4 = s->img_buffer;
  psVar5 = s->img_buffer_end;
  if (psVar4 < psVar5) {
    psVar3 = psVar4 + 1;
    s->img_buffer = psVar3;
    sVar6 = *psVar4;
  }
  else {
    if (s->read_from_callbacks == 0) goto LAB_00111fa8;
    psVar5 = s->buffer_start;
    iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar5,s->buflen);
    if (iVar2 == 0) {
      s->read_from_callbacks = 0;
      psVar5 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      sVar6 = '\0';
    }
    else {
      sVar6 = *psVar5;
      psVar5 = psVar5 + iVar2;
    }
    psVar3 = s->buffer_start + 1;
    s->img_buffer_end = psVar5;
    s->img_buffer = psVar3;
  }
  if (sVar6 == 'G') {
    if (psVar3 < psVar5) {
      psVar4 = psVar3 + 1;
      s->img_buffer = psVar4;
      sVar6 = *psVar3;
    }
    else {
      if (s->read_from_callbacks == 0) goto LAB_00111fa8;
      psVar5 = s->buffer_start;
      iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar5,s->buflen);
      if (iVar2 == 0) {
        s->read_from_callbacks = 0;
        psVar5 = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
        sVar6 = '\0';
      }
      else {
        sVar6 = *psVar5;
        psVar5 = psVar5 + iVar2;
      }
      psVar4 = s->buffer_start + 1;
      s->img_buffer_end = psVar5;
      s->img_buffer = psVar4;
    }
    if (sVar6 == 'I') {
      if (psVar4 < psVar5) {
        psVar3 = psVar4 + 1;
        s->img_buffer = psVar3;
        sVar6 = *psVar4;
      }
      else {
        if (s->read_from_callbacks == 0) goto LAB_00111fa8;
        psVar5 = s->buffer_start;
        iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar5,s->buflen);
        if (iVar2 == 0) {
          s->read_from_callbacks = 0;
          psVar5 = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
          sVar6 = '\0';
        }
        else {
          sVar6 = *psVar5;
          psVar5 = psVar5 + iVar2;
        }
        psVar3 = s->buffer_start + 1;
        s->img_buffer_end = psVar5;
        s->img_buffer = psVar3;
      }
      if (sVar6 == 'F') {
        if (psVar3 < psVar5) {
          psVar4 = psVar3 + 1;
          s->img_buffer = psVar4;
          sVar6 = *psVar3;
        }
        else {
          if (s->read_from_callbacks == 0) goto LAB_00111fa8;
          psVar5 = s->buffer_start;
          iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar5,s->buflen);
          if (iVar2 == 0) {
            s->read_from_callbacks = 0;
            psVar5 = s->buffer_start + 1;
            s->buffer_start[0] = '\0';
            sVar6 = '\0';
          }
          else {
            sVar6 = *psVar5;
            psVar5 = psVar5 + iVar2;
          }
          psVar4 = s->buffer_start + 1;
          s->img_buffer_end = psVar5;
          s->img_buffer = psVar4;
        }
        if (sVar6 == '8') {
          if (psVar4 < psVar5) {
            psVar3 = psVar4 + 1;
            s->img_buffer = psVar3;
            sVar6 = *psVar4;
          }
          else {
            if (s->read_from_callbacks == 0) goto LAB_00111fa8;
            psVar5 = s->buffer_start;
            iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar5,s->buflen);
            if (iVar2 == 0) {
              s->read_from_callbacks = 0;
              psVar5 = s->buffer_start + 1;
              s->buffer_start[0] = '\0';
              sVar6 = '\0';
            }
            else {
              sVar6 = *psVar5;
              psVar5 = psVar5 + iVar2;
            }
            psVar3 = s->buffer_start + 1;
            s->img_buffer_end = psVar5;
            s->img_buffer = psVar3;
          }
          if ((sVar6 == '7') || (sVar6 == '9')) {
            if (psVar3 < psVar5) {
              s->img_buffer = psVar3 + 1;
              sVar6 = *psVar3;
            }
            else {
              if (s->read_from_callbacks == 0) goto LAB_00111fa8;
              psVar5 = s->buffer_start;
              iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar5,s->buflen);
              if (iVar2 == 0) {
                s->read_from_callbacks = 0;
                psVar5 = s->buffer_start + 1;
                s->buffer_start[0] = '\0';
                sVar6 = '\0';
              }
              else {
                sVar6 = *psVar5;
                psVar5 = psVar5 + iVar2;
              }
              s->img_buffer_end = psVar5;
              s->img_buffer = s->buffer_start + 1;
            }
            if (sVar6 == 'a') {
              stbi__g_failure_reason = "";
              iVar2 = stbi__get16le(s);
              g->w = iVar2;
              iVar2 = stbi__get16le(s);
              g->h = iVar2;
              psVar4 = s->img_buffer;
              psVar5 = s->img_buffer_end;
              if (psVar4 < psVar5) {
                s->img_buffer = psVar4 + 1;
                bVar1 = *psVar4;
                psVar4 = psVar4 + 1;
              }
              else if (s->read_from_callbacks == 0) {
                bVar1 = 0;
              }
              else {
                psVar5 = s->buffer_start;
                iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar5,s->buflen);
                if (iVar2 == 0) {
                  s->read_from_callbacks = 0;
                  psVar5 = s->buffer_start + 1;
                  s->buffer_start[0] = '\0';
                  bVar1 = 0;
                }
                else {
                  bVar1 = *psVar5;
                  psVar5 = psVar5 + iVar2;
                }
                psVar4 = s->buffer_start + 1;
                s->img_buffer_end = psVar5;
                s->img_buffer = psVar4;
              }
              g->flags = (uint)bVar1;
              if (psVar4 < psVar5) {
                s->img_buffer = psVar4 + 1;
                uVar7 = (uint)*psVar4;
                psVar4 = psVar4 + 1;
              }
              else if (s->read_from_callbacks == 0) {
                uVar7 = 0;
              }
              else {
                psVar5 = s->buffer_start;
                iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar5,s->buflen);
                if (iVar2 == 0) {
                  s->read_from_callbacks = 0;
                  psVar5 = s->buffer_start + 1;
                  s->buffer_start[0] = '\0';
                  uVar7 = 0;
                }
                else {
                  uVar7 = (uint)*psVar5;
                  psVar5 = psVar5 + iVar2;
                }
                psVar4 = s->buffer_start + 1;
                s->img_buffer_end = psVar5;
                s->img_buffer = psVar4;
              }
              g->bgindex = uVar7;
              if (psVar4 < psVar5) {
                s->img_buffer = psVar4 + 1;
                bVar1 = *psVar4;
              }
              else if (s->read_from_callbacks == 0) {
                bVar1 = 0;
              }
              else {
                psVar5 = s->buffer_start;
                iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar5,s->buflen);
                if (iVar2 == 0) {
                  s->read_from_callbacks = 0;
                  psVar5 = s->buffer_start + 1;
                  s->buffer_start[0] = '\0';
                  bVar1 = 0;
                }
                else {
                  bVar1 = *psVar5;
                  psVar5 = psVar5 + iVar2;
                }
                s->img_buffer_end = psVar5;
                s->img_buffer = s->buffer_start + 1;
              }
              g->ratio = (uint)bVar1;
              g->transparent = -1;
              if (comp != (int *)0x0) {
                *comp = 4;
              }
              if (is_info != 0) {
                return 1;
              }
              bVar1 = (byte)g->flags;
              if (-1 < (char)bVar1) {
                return 1;
              }
              stbi__gif_parse_colortable(s,g->pal,2 << (bVar1 & 7),-1);
              return 1;
            }
          }
        }
      }
    }
  }
LAB_00111fa8:
  stbi__g_failure_reason = "not GIF";
  return 0;
}

Assistant:

static int stbi__gif_header(stbi__context *s, stbi__gif *g, int *comp, int is_info)
{
   stbi_uc version;
   if (stbi__get8(s) != 'G' || stbi__get8(s) != 'I' || stbi__get8(s) != 'F' || stbi__get8(s) != '8')
      return stbi__err("not GIF", "Corrupt GIF");

   version = stbi__get8(s);
   if (version != '7' && version != '9')    return stbi__err("not GIF", "Corrupt GIF");
   if (stbi__get8(s) != 'a')                return stbi__err("not GIF", "Corrupt GIF");

   stbi__g_failure_reason = "";
   g->w = stbi__get16le(s);
   g->h = stbi__get16le(s);
   g->flags = stbi__get8(s);
   g->bgindex = stbi__get8(s);
   g->ratio = stbi__get8(s);
   g->transparent = -1;

   if (comp != 0) *comp = 4;  // can't actually tell whether it's 3 or 4 until we parse the comments

   if (is_info) return 1;

   if (g->flags & 0x80)
      stbi__gif_parse_colortable(s,g->pal, 2 << (g->flags & 7), -1);

   return 1;
}